

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O2

LeastSq * benchmark::MinimalLeastSq
                    (LeastSq *__return_storage_ptr__,vector<int,_std::allocator<int>_> *n,
                    vector<double,_std::allocator<double>_> *time,BigOFunc *fitting_curve)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_50 = 0.0;
  uVar4 = 0;
  while( true ) {
    piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((ulong)((long)piVar2 - (long)piVar1 >> 2) <= uVar4) break;
    dVar5 = (*fitting_curve)(piVar1[uVar4]);
    dVar7 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    local_50 = local_50 + dVar7;
    local_48 = local_48 + dVar5 * dVar7;
    dStack_40 = dStack_40 + dVar5 * dVar5;
    uVar4 = uVar4 + 1;
  }
  __return_storage_ptr__->complexity = oLambda;
  __return_storage_ptr__->coef = local_48 / dStack_40;
  dVar7 = 0.0;
  uVar4 = 0;
  while( true ) {
    uVar3 = (long)piVar2 - (long)piVar1 >> 2;
    if (uVar3 <= uVar4) break;
    dVar5 = (*fitting_curve)(piVar1[uVar4]);
    dVar5 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4] - dVar5 * (local_48 / dStack_40);
    dVar7 = dVar7 + dVar5 * dVar5;
    uVar4 = uVar4 + 1;
    piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  auVar6._8_4_ = (int)((long)piVar2 - (long)piVar1 >> 0x22);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  dVar7 = dVar7 / dVar5;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  __return_storage_ptr__->rms = dVar7 / (local_50 / dVar5);
  return __return_storage_ptr__;
}

Assistant:

LeastSq MinimalLeastSq(const std::vector<int>& n,
                       const std::vector<double>& time,
                       BigOFunc* fitting_curve) {
  double sigma_gn = 0.0;
  double sigma_gn_squared = 0.0;
  double sigma_time = 0.0;
  double sigma_time_gn = 0.0;

  // Calculate least square fitting parameter
  for (size_t i = 0; i < n.size(); ++i) {
    double gn_i = fitting_curve(n[i]);
    sigma_gn += gn_i;
    sigma_gn_squared += gn_i * gn_i;
    sigma_time += time[i];
    sigma_time_gn += time[i] * gn_i;
  }

  LeastSq result;
  result.complexity = oLambda;

  // Calculate complexity.
  result.coef = sigma_time_gn / sigma_gn_squared;

  // Calculate RMS
  double rms = 0.0;
  for (size_t i = 0; i < n.size(); ++i) {
    double fit = result.coef * fitting_curve(n[i]);
    rms += pow((time[i] - fit), 2);
  }

  // Normalized RMS by the mean of the observed values
  double mean = sigma_time / n.size();
  result.rms = sqrt(rms / n.size()) / mean;

  return result;
}